

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
BeliefSparse::InnerProduct
          (BeliefSparse *this,VectorSet *v,vector<bool,_std::allocator<bool>_> *mask)

{
  const_reference cVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pdVar5;
  reference pvVar6;
  int __c;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDX;
  char *__s;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  BScit it;
  uint k;
  double x;
  vector<double,_std::allocator<double>_> *values;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff08;
  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
  *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff20;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff28;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff30;
  char local_78 [16];
  const_iterator local_68;
  uint local_54;
  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
  *local_50;
  undefined8 local_30;
  undefined1 local_21;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_18;
  
  local_21 = 0;
  local_18 = in_RDX;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size1(in_RDX);
  local_30 = 0xffefffffffffffff;
  std::allocator<double>::allocator((allocator<double> *)0x9c2f4f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
             (size_type)in_stack_ffffffffffffff28,(value_type_conflict3 *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::allocator<double>::~allocator((allocator<double> *)0x9c2f7a);
  for (local_54 = 0; uVar3 = (ulong)local_54,
      sVar4 = boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::size1(local_18), uVar3 != sVar4; local_54 = local_54 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    if (cVar1) {
      local_50 = (bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                  *)0x0;
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::begin(in_stack_ffffffffffffff08);
      while( true ) {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::end(in_stack_ffffffffffffff08);
        __s = local_78;
        bVar2 = boost::numeric::ublas::
                bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                ::operator!=(in_stack_ffffffffffffff10,
                             (derived_iterator_type *)in_stack_ffffffffffffff08);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::~const_iterator((const_iterator *)0x9c3047);
        if (!bVar2) break;
        pdVar5 = boost::numeric::ublas::
                 compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator::operator*((const_iterator *)in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff20 =
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)*pdVar5;
        in_stack_ffffffffffffff30 = (vector<bool,_std::allocator<bool>_> *)(ulong)local_54;
        in_stack_ffffffffffffff28 = local_18;
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::index(&local_68,__s,__c);
        in_stack_ffffffffffffff18 =
             (allocator_type *)
             boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::operator()(in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18,
                          (size_type)in_stack_ffffffffffffff10);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = in_stack_ffffffffffffff20;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(double *)in_stack_ffffffffffffff18;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_50;
        auVar7 = vfmadd213sd_fma(auVar7,auVar8,auVar9);
        local_50 = auVar7._0_8_;
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::operator++(&local_68);
      }
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::const_iterator::~const_iterator((const_iterator *)0x9c3060);
      in_stack_ffffffffffffff10 = local_50;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_54);
      *pvVar6 = (value_type)in_stack_ffffffffffffff10;
    }
  }
  return in_RDI;
}

Assistant:

vector<double> BeliefSparse::InnerProduct(const VectorSet &v,
                                          const vector<bool> &mask) const
{
    vector<double> values(v.size1(),-DBL_MAX);

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        if(mask[k])
        {
            x=0;
            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                x+=(*it)*v(k,it.index());
            values[k]=x;
        }
    }

    return(values);
}